

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O1

int Res_WinComputeRoots(Res_Win_t *p)

{
  ulong uVar1;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  
  p->vRoots->nSize = 0;
  pAVar2 = p->pNode->pNtk;
  if ((pAVar2->vTravIds).pArray == (int *)0x0) {
    iVar3 = pAVar2->vObjs->nSize;
    uVar1 = (long)iVar3 + 500;
    iVar5 = (int)uVar1;
    if ((pAVar2->vTravIds).nCap < iVar5) {
      piVar4 = (int *)malloc(uVar1 * 4);
      (pAVar2->vTravIds).pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar2->vTravIds).nCap = iVar5;
    }
    if (-500 < iVar3) {
      memset((pAVar2->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pAVar2->vTravIds).nSize = iVar5;
  }
  iVar3 = pAVar2->nTravIds;
  pAVar2->nTravIds = iVar3 + 1;
  if (iVar3 < 0x3fffffff) {
    Res_WinComputeRoots_rec
              (p->pNode,(*(uint *)&p->pNode->field_0x14 >> 0xc) + p->nWinTfoMax,p->nFanoutLimit,
               p->vRoots);
    iVar3 = p->vRoots->nSize;
    if (0 < iVar3) {
      if ((iVar3 == 1) && ((Abc_Obj_t *)*p->vRoots->pArray == p->pNode)) {
        iVar3 = 0;
      }
      else {
        iVar3 = 1;
      }
      return iVar3;
    }
    __assert_fail("Vec_PtrSize(p->vRoots) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                  ,0xe4,"int Res_WinComputeRoots(Res_Win_t *)");
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int Res_WinComputeRoots( Res_Win_t * p )
{
    Vec_PtrClear( p->vRoots );
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Res_WinComputeRoots_rec( p->pNode, p->pNode->Level + p->nWinTfoMax, p->nFanoutLimit, p->vRoots );
    assert( Vec_PtrSize(p->vRoots) > 0 );
    if ( Vec_PtrSize(p->vRoots) == 1 && Vec_PtrEntry(p->vRoots, 0) == p->pNode )
        return 0;
    return 1;
}